

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

void decorr_stereo_pass(decorr_pass *dpp,int32_t *buffer,int32_t sample_count)

{
  int32_t *piVar1;
  int32_t *piVar2;
  uint *puVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  int32_t temp_samples [8];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (int)dpp->delta;
  iVar8 = (int)dpp->weight_A;
  iVar7 = (int)dpp->weight_B;
  puVar3 = (uint *)(buffer + (uint)(sample_count * 2));
  uVar4 = dpp->term;
  if (uVar4 == 0x11) {
    for (; buffer < puVar3; buffer = (int32_t *)((uint *)buffer + 2)) {
      iVar14 = dpp->samples_A[1];
      iVar5 = dpp->samples_A[0] * 2;
      uVar10 = iVar5 - iVar14;
      dpp->samples_A[1] = dpp->samples_A[0];
      if ((int)(short)(ushort)uVar10 == uVar10) {
        iVar15 = (int)(uVar10 * iVar8 + 0x200) >> 10;
      }
      else {
        iVar15 = (int)(((ulong)(ushort)uVar10 * (long)iVar8 >> 9) +
                       ((ulong)(long)(int)uVar10 >> 9 & 0x1ffffff80) * (long)iVar8 + 1 >> 1);
      }
      uVar13 = *buffer;
      dpp->samples_A[0] = iVar15 + uVar13;
      if ((iVar5 != iVar14) && (*buffer != 0)) {
        iVar8 = iVar8 + ((int)(*buffer ^ uVar10) >> 0x1e | 1U) * iVar6;
      }
      *buffer = iVar15 + uVar13;
      iVar14 = dpp->samples_B[1];
      iVar5 = dpp->samples_B[0] * 2;
      uVar10 = iVar5 - iVar14;
      dpp->samples_B[1] = dpp->samples_B[0];
      if ((int)(short)(ushort)uVar10 == uVar10) {
        iVar15 = (int)(uVar10 * iVar7 + 0x200) >> 10;
      }
      else {
        iVar15 = (int)(((ulong)(ushort)uVar10 * (long)iVar7 >> 9) +
                       ((ulong)(long)(int)uVar10 >> 9 & 0x1ffffff80) * (long)iVar7 + 1 >> 1);
      }
      uVar13 = ((uint *)buffer)[1];
      dpp->samples_B[0] = iVar15 + uVar13;
      if ((iVar5 != iVar14) && (((uint *)buffer)[1] != 0)) {
        iVar7 = iVar7 + ((int)(((uint *)buffer)[1] ^ uVar10) >> 0x1e | 1U) * iVar6;
      }
      ((uint *)buffer)[1] = iVar15 + uVar13;
    }
  }
  else if (uVar4 == 0x12) {
    for (; buffer < puVar3; buffer = (int32_t *)((uint *)buffer + 2)) {
      uVar13 = dpp->samples_A[0] * 3 - dpp->samples_A[1];
      uVar10 = (int)uVar13 >> 1;
      dpp->samples_A[1] = dpp->samples_A[0];
      if ((int)(short)uVar10 == uVar10) {
        iVar14 = (int)(uVar10 * iVar8 + 0x200) >> 10;
      }
      else {
        iVar14 = (int)((((long)(int)uVar10 & 0xffffU) * (long)iVar8 >> 9) +
                       ((ulong)(long)(int)uVar10 >> 9 & 0x1ffffff80) * (long)iVar8 + 1 >> 1);
      }
      uVar11 = *buffer;
      dpp->samples_A[0] = iVar14 + uVar11;
      if ((1 < uVar13) && (*buffer != 0)) {
        iVar8 = iVar8 + ((int)(*buffer ^ uVar10) >> 0x1e | 1U) * iVar6;
      }
      *buffer = iVar14 + uVar11;
      uVar13 = dpp->samples_B[0] * 3 - dpp->samples_B[1];
      uVar10 = (int)uVar13 >> 1;
      dpp->samples_B[1] = dpp->samples_B[0];
      if ((int)(short)uVar10 == uVar10) {
        iVar14 = (int)(uVar10 * iVar7 + 0x200) >> 10;
      }
      else {
        iVar14 = (int)((((long)(int)uVar10 & 0xffffU) * (long)iVar7 >> 9) +
                       ((ulong)(long)(int)uVar10 >> 9 & 0x1ffffff80) * (long)iVar7 + 1 >> 1);
      }
      uVar11 = ((uint *)buffer)[1];
      dpp->samples_B[0] = iVar14 + uVar11;
      if ((1 < uVar13) && (((uint *)buffer)[1] != 0)) {
        iVar7 = iVar7 + ((int)(((uint *)buffer)[1] ^ uVar10) >> 0x1e | 1U) * iVar6;
      }
      ((uint *)buffer)[1] = iVar14 + uVar11;
    }
  }
  else {
    uVar10 = (uint)uVar4;
    if (uVar10 == 0xffff) {
      for (; buffer < puVar3; buffer = (int32_t *)((uint *)buffer + 2)) {
        uVar10 = *buffer;
        uVar13 = dpp->samples_A[0];
        if ((int)(short)uVar13 == uVar13) {
          uVar11 = ((int)(uVar13 * iVar8 + 0x200) >> 10) + uVar10;
          if (uVar13 != 0) goto LAB_001a0a73;
        }
        else {
          uVar11 = (int)(((ulong)(uVar13 & 0xffff) * (long)iVar8 >> 9) +
                         ((ulong)(long)(int)uVar13 >> 9 & 0x1ffffff80) * (long)iVar8 + 1 >> 1) +
                   uVar10;
LAB_001a0a73:
          if (uVar10 != 0) {
            if ((int)(uVar13 ^ uVar10) < 0) {
              iVar8 = iVar8 - iVar6;
              iVar14 = -0x400;
              if (iVar8 < -0x400) goto LAB_001a0a92;
            }
            else {
              iVar8 = iVar8 + iVar6;
              iVar14 = 0x400;
              if (0x400 < iVar8) {
LAB_001a0a92:
                iVar8 = iVar14;
              }
            }
          }
        }
        *buffer = uVar11;
        if ((int)(short)(ushort)uVar11 == uVar11) {
          uVar10 = ((int)(uVar11 * iVar7 + 0x200) >> 10) + ((uint *)buffer)[1];
          dpp->samples_A[0] = uVar10;
          if (uVar11 != 0) goto LAB_001a0af3;
        }
        else {
          uVar10 = ((uint *)buffer)[1] +
                   (int)(((ulong)(long)(int)uVar11 >> 9 & 0x1ffffff80) * (long)iVar7 +
                         ((ulong)(ushort)uVar11 * (long)iVar7 >> 9) + 1 >> 1);
          dpp->samples_A[0] = uVar10;
LAB_001a0af3:
          if (((uint *)buffer)[1] != 0) {
            if ((int)(((uint *)buffer)[1] ^ uVar11) < 0) {
              iVar7 = iVar7 - iVar6;
              iVar14 = -0x400;
              if (iVar7 < -0x400) goto LAB_001a0b11;
            }
            else {
              iVar7 = iVar7 + iVar6;
              iVar14 = 0x400;
              if (0x400 < iVar7) {
LAB_001a0b11:
                iVar7 = iVar14;
              }
            }
          }
        }
        ((uint *)buffer)[1] = uVar10;
      }
    }
    else if (uVar10 == 0xfffe) {
      for (; buffer < puVar3; buffer = (int32_t *)((uint *)buffer + 2)) {
        uVar10 = ((uint *)buffer)[1];
        uVar13 = dpp->samples_B[0];
        if ((int)(short)uVar13 == uVar13) {
          uVar11 = ((int)(uVar13 * iVar7 + 0x200) >> 10) + uVar10;
          if (uVar13 != 0) goto LAB_001a092e;
        }
        else {
          uVar11 = (int)(((ulong)(uVar13 & 0xffff) * (long)iVar7 >> 9) +
                         ((ulong)(long)(int)uVar13 >> 9 & 0x1ffffff80) * (long)iVar7 + 1 >> 1) +
                   uVar10;
LAB_001a092e:
          if (uVar10 != 0) {
            if ((int)(uVar13 ^ uVar10) < 0) {
              iVar7 = iVar7 - iVar6;
              iVar14 = -0x400;
              if (iVar7 < -0x400) goto LAB_001a094c;
            }
            else {
              iVar7 = iVar7 + iVar6;
              iVar14 = 0x400;
              if (0x400 < iVar7) {
LAB_001a094c:
                iVar7 = iVar14;
              }
            }
          }
        }
        ((uint *)buffer)[1] = uVar11;
        if ((int)(short)(ushort)uVar11 == uVar11) {
          uVar10 = ((int)(uVar11 * iVar8 + 0x200) >> 10) + *buffer;
          dpp->samples_B[0] = uVar10;
          if (uVar11 != 0) goto LAB_001a09ad;
        }
        else {
          uVar10 = *buffer + (int)(((ulong)(long)(int)uVar11 >> 9 & 0x1ffffff80) * (long)iVar8 +
                                   ((ulong)(ushort)uVar11 * (long)iVar8 >> 9) + 1 >> 1);
          dpp->samples_B[0] = uVar10;
LAB_001a09ad:
          if (*buffer != 0) {
            if ((int)(*buffer ^ uVar11) < 0) {
              iVar8 = iVar8 - iVar6;
              iVar14 = -0x400;
              if (iVar8 < -0x400) goto LAB_001a09cb;
            }
            else {
              iVar8 = iVar8 + iVar6;
              iVar14 = 0x400;
              if (0x400 < iVar8) {
LAB_001a09cb:
                iVar8 = iVar14;
              }
            }
          }
        }
        *buffer = uVar10;
      }
    }
    else if (uVar10 == 0xfffd) {
      for (; buffer < puVar3; buffer = (int32_t *)((uint *)buffer + 2)) {
        uVar10 = *buffer;
        uVar13 = dpp->samples_A[0];
        if ((int)(short)uVar13 == uVar13) {
          uVar11 = ((int)(uVar13 * iVar8 + 0x200) >> 10) + uVar10;
          if (uVar13 != 0) goto LAB_001a06ca;
        }
        else {
          uVar11 = (int)(((ulong)(uVar13 & 0xffff) * (long)iVar8 >> 9) +
                         ((ulong)(long)(int)uVar13 >> 9 & 0x1ffffff80) * (long)iVar8 + 1 >> 1) +
                   uVar10;
LAB_001a06ca:
          if (uVar10 != 0) {
            if ((int)(uVar13 ^ uVar10) < 0) {
              iVar8 = iVar8 - iVar6;
              iVar14 = -0x400;
              if (iVar8 < -0x400) goto LAB_001a06e9;
            }
            else {
              iVar8 = iVar8 + iVar6;
              iVar14 = 0x400;
              if (0x400 < iVar8) {
LAB_001a06e9:
                iVar8 = iVar14;
              }
            }
          }
        }
        uVar10 = ((uint *)buffer)[1];
        uVar13 = dpp->samples_B[0];
        if ((int)(short)uVar13 == uVar13) {
          uVar12 = ((int)(uVar13 * iVar7 + 0x200) >> 10) + uVar10;
          if (uVar13 != 0) goto LAB_001a0742;
        }
        else {
          uVar12 = (int)(((ulong)(uVar13 & 0xffff) * (long)iVar7 >> 9) +
                         ((ulong)(long)(int)uVar13 >> 9 & 0x1ffffff80) * (long)iVar7 + 1 >> 1) +
                   uVar10;
LAB_001a0742:
          if (uVar10 != 0) {
            if ((int)(uVar13 ^ uVar10) < 0) {
              iVar7 = iVar7 - iVar6;
              iVar14 = -0x400;
              if (iVar7 < -0x400) goto LAB_001a075b;
            }
            else {
              iVar7 = iVar7 + iVar6;
              iVar14 = 0x400;
              if (0x400 < iVar7) {
LAB_001a075b:
                iVar7 = iVar14;
              }
            }
          }
        }
        dpp->samples_B[0] = uVar11;
        *buffer = uVar11;
        dpp->samples_A[0] = uVar12;
        ((uint *)buffer)[1] = uVar12;
      }
    }
    else {
      piVar1 = dpp->samples_A;
      piVar2 = dpp->samples_B;
      uVar13 = 0;
      while( true ) {
        uVar10 = uVar10 & 7;
        if (puVar3 <= buffer) break;
        uVar11 = piVar1[uVar13];
        if ((int)(short)uVar11 == uVar11) {
          iVar14 = (int)(uVar11 * iVar8 + 0x200) >> 10;
        }
        else {
          iVar14 = (int)(((ulong)(long)(int)uVar11 >> 9 & 0x1ffffff80) * (long)iVar8 +
                         ((ulong)(uVar11 & 0xffff) * (long)iVar8 >> 9) + 1 >> 1);
        }
        uVar12 = *buffer;
        piVar1[uVar10] = iVar14 + uVar12;
        if ((uVar11 != 0) && (*buffer != 0)) {
          iVar8 = iVar8 + ((int)(*buffer ^ uVar11) >> 0x1e | 1U) * iVar6;
        }
        *buffer = iVar14 + uVar12;
        uVar11 = piVar2[uVar13];
        if ((int)(short)uVar11 == uVar11) {
          iVar14 = (int)(uVar11 * iVar7 + 0x200) >> 10;
        }
        else {
          iVar14 = (int)(((ulong)(uVar11 & 0xffff) * (long)iVar7 >> 9) +
                         ((ulong)(long)(int)uVar11 >> 9 & 0x1ffffff80) * (long)iVar7 + 1 >> 1);
        }
        uVar12 = ((uint *)buffer)[1];
        piVar2[uVar10] = iVar14 + uVar12;
        if ((uVar11 != 0) && (((uint *)buffer)[1] != 0)) {
          iVar7 = iVar7 + ((int)(((uint *)buffer)[1] ^ uVar11) >> 0x1e | 1U) * iVar6;
        }
        ((uint *)buffer)[1] = iVar14 + uVar12;
        uVar13 = uVar13 + 1 & 7;
        uVar10 = uVar10 + 1;
        buffer = (int32_t *)((uint *)buffer + 2);
      }
      if (uVar13 != 0) {
        local_48 = *(undefined8 *)(dpp->samples_A + 4);
        uStack_40 = *(undefined8 *)(dpp->samples_A + 6);
        local_58 = *(undefined8 *)piVar1;
        uStack_50 = *(undefined8 *)(dpp->samples_A + 2);
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
          piVar1[lVar9] = *(int32_t *)((long)&local_58 + (ulong)(uVar13 + (int)lVar9 & 7) * 4);
        }
        local_48 = *(undefined8 *)(dpp->samples_B + 4);
        uStack_40 = *(undefined8 *)(dpp->samples_B + 6);
        local_58 = *(undefined8 *)piVar2;
        uStack_50 = *(undefined8 *)(dpp->samples_B + 2);
        uVar13 = uVar13 + 8;
        for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 4) {
          *(undefined4 *)((long)piVar2 + lVar9) =
               *(undefined4 *)((long)&local_58 + (ulong)(uVar13 & 7) * 4);
          uVar13 = uVar13 + 1;
        }
      }
    }
  }
  dpp->weight_A = (short)iVar8;
  dpp->weight_B = (short)iVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void decorr_stereo_pass (struct decorr_pass *dpp, int32_t *buffer, int32_t sample_count)
{
    int32_t delta = dpp->delta, weight_A = dpp->weight_A, weight_B = dpp->weight_B;
    int32_t *bptr, *eptr = buffer + (sample_count * 2), sam_A, sam_B;
    int m, k;

    switch (dpp->term) {

        case 17:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = 2 * dpp->samples_A [0] - dpp->samples_A [1];
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];

                sam_A = 2 * dpp->samples_B [0] - dpp->samples_B [1];
                dpp->samples_B [1] = dpp->samples_B [0];
                dpp->samples_B [0] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [0];
            }

            break;

        case 18:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = (3 * dpp->samples_A [0] - dpp->samples_A [1]) >> 1;
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];

                sam_A = (3 * dpp->samples_B [0] - dpp->samples_B [1]) >> 1;
                dpp->samples_B [1] = dpp->samples_B [0];
                dpp->samples_B [0] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [0];
            }

            break;

        default:
            for (m = 0, k = dpp->term & (MAX_TERM - 1), bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = dpp->samples_A [m];
                dpp->samples_A [k] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [k];

                sam_A = dpp->samples_B [m];
                dpp->samples_B [k] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [k];

                m = (m + 1) & (MAX_TERM - 1);
                k = (k + 1) & (MAX_TERM - 1);
            }

            if (m) {
                int32_t temp_samples [MAX_TERM];

                memcpy (temp_samples, dpp->samples_A, sizeof (dpp->samples_A));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_A [k] = temp_samples [m & (MAX_TERM - 1)];

                memcpy (temp_samples, dpp->samples_B, sizeof (dpp->samples_B));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_B [k] = temp_samples [m & (MAX_TERM - 1)];
            }

            break;

        case -1:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = bptr [0] + apply_weight (weight_A, dpp->samples_A [0]);
                update_weight_clip (weight_A, delta, dpp->samples_A [0], bptr [0]);
                bptr [0] = sam_A;
                dpp->samples_A [0] = bptr [1] + apply_weight (weight_B, sam_A);
                update_weight_clip (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_A [0];
            }

            break;

        case -2:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_B = bptr [1] + apply_weight (weight_B, dpp->samples_B [0]);
                update_weight_clip (weight_B, delta, dpp->samples_B [0], bptr [1]);
                bptr [1] = sam_B;
                dpp->samples_B [0] = bptr [0] + apply_weight (weight_A, sam_B);
                update_weight_clip (weight_A, delta, sam_B, bptr [0]);
                bptr [0] = dpp->samples_B [0];
            }

            break;

        case -3:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = bptr [0] + apply_weight (weight_A, dpp->samples_A [0]);
                update_weight_clip (weight_A, delta, dpp->samples_A [0], bptr [0]);
                sam_B = bptr [1] + apply_weight (weight_B, dpp->samples_B [0]);
                update_weight_clip (weight_B, delta, dpp->samples_B [0], bptr [1]);
                bptr [0] = dpp->samples_B [0] = sam_A;
                bptr [1] = dpp->samples_A [0] = sam_B;
            }

            break;
    }

    dpp->weight_A = weight_A;
    dpp->weight_B = weight_B;
}